

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall mpt::convertable::convertable(convertable *this)

{
  convertable *this_local;
  
  this->_vptr_convertable = (_func_int **)&PTR___cxa_pure_virtual_00109b28;
  return;
}

Assistant:

MPT_INTERFACE(convertable)
{
protected:
	inline ~convertable() { }
public:
	const char *string();
	
	inline const uint8_t *types()
	{
		uint8_t *t = 0;
		return (convert(0, &t) < 0) ? 0 : t;
	}
	inline int type()
	{
		return convert(0, 0);
	}
	
	template<typename T>
	bool get(T &val);
	
	template<typename T>
	operator T *();
	
	virtual int convert(type_t , void *) = 0;
	
	static const struct named_traits *pointer_traits();
}